

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qteamcitylogger.cpp
# Opt level: O2

void __thiscall
QTeamCityLogger::tcEscapedString(QTeamCityLogger *this,QTestCharBuffer *buf,char *str)

{
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  void *pvVar4;
  byte *pbVar5;
  char *p;
  char *pcVar6;
  byte bVar7;
  long lVar8;
  
  sVar3 = qstrlen(str);
  lVar8 = sVar3 + 1;
  for (pcVar6 = str; *pcVar6 != '\0'; pcVar6 = pcVar6 + 1) {
    pvVar4 = memchr("\n\r|[]\'",(int)*pcVar6,7);
    lVar8 = (lVar8 + 1) - (ulong)(pvVar4 == (void *)0x0);
  }
  QTestCharBuffer::resize(buf,(int)lVar8);
  pbVar5 = (byte *)buf->buf;
  bVar1 = true;
  do {
    bVar7 = *str;
    if ((bVar7 - 0x5b < 0x22) && ((0x200000005U >> ((ulong)(bVar7 - 0x5b) & 0x3f) & 1) != 0)) {
LAB_00124a85:
      *pbVar5 = 0x7c;
      pbVar5 = pbVar5 + 1;
      bVar2 = false;
LAB_00124a8e:
      bVar1 = bVar2;
      *pbVar5 = bVar7;
      pbVar5 = pbVar5 + 1;
    }
    else {
      if (bVar7 == 10) {
        bVar7 = 0x6e;
        goto LAB_00124a85;
      }
      if (bVar7 == 0xd) {
        bVar7 = 0x72;
        goto LAB_00124a85;
      }
      if (bVar7 == 0x27) goto LAB_00124a85;
      if (bVar7 == 0) {
        if (bVar1) {
          pbVar5 = pbVar5 + -(ulong)(buf->buf < pbVar5);
        }
        *pbVar5 = 0;
        return;
      }
      bVar2 = false;
      if ((0x3f < bVar7) || ((1L << (bVar7 & 0x3f) & 0x100003e00U) == 0)) goto LAB_00124a8e;
      if (!bVar1) {
        bVar7 = 0x20;
        bVar2 = true;
        goto LAB_00124a8e;
      }
    }
    str = (char *)((byte *)str + 1);
  } while( true );
}

Assistant:

void QTeamCityLogger::tcEscapedString(QTestCharBuffer *buf, const char *str) const
{
    {
        size_t size = qstrlen(str) + 1;
        for (const char *p = str; *p; ++p) {
            if (strchr("\n\r|[]'", *p))
                ++size;
        }
        Q_ASSERT(size <= size_t(INT_MAX));
        buf->resize(int(size));
    }

    bool swallowSpace = true;
    char *p = buf->data();
    for (; *str; ++str) {
        char ch = *str;
        switch (ch) {
        case '\n':
            p++[0] = '|';
            ch = 'n';
            swallowSpace = false;
            break;
        case '\r':
            p++[0] = '|';
            ch = 'r';
            swallowSpace = false;
            break;
        case '|':
        case '[':
        case ']':
        case '\'':
            p++[0] = '|';
            swallowSpace = false;
            break;
        default:
            if (ascii_isspace(ch)) {
                if (swallowSpace)
                    continue;
                swallowSpace = true;
                ch = ' ';
            } else {
                swallowSpace = false;
            }
            break;
        }
        p++[0] = ch;
    }
    Q_ASSERT(p < buf->data() + buf->size());
    if (swallowSpace && p > buf->data()) {
        Q_ASSERT(p[-1] == ' ');
        --p;
    }
    Q_ASSERT(p == buf->data() || !ascii_isspace(p[-1]));
    *p = '\0';
}